

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O3

exr_result_t generic_unpack_deep(exr_decode_pipeline_t *decode)

{
  char cVar1;
  uint16_t uVar2;
  int iVar3;
  uint uVar4;
  exr_coding_channel_info_t *peVar5;
  uint uVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int32_t *piVar15;
  ushort uVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  void *pvVar23;
  int iVar24;
  long lVar25;
  float *pfVar26;
  
  iVar3 = (decode->chunk).height;
  if (0 < iVar3) {
    uVar4 = (decode->chunk).width;
    piVar15 = decode->sample_count_table;
    pvVar23 = decode->unpacked_buffer;
    uVar16 = decode->channel_count;
    lVar20 = 0;
    iVar10 = 0;
    do {
      if (0 < (short)uVar16) {
        uVar11 = (ulong)uVar16;
        peVar5 = decode->channels;
        uVar13 = 0;
        do {
          uVar22 = uVar13 + 1;
          cVar1 = peVar5[uVar13].bytes_per_element;
          if (peVar5[uVar13].field_12.decode_to_ptr == (uint8_t *)0x0) {
            if ((decode->decode_flags & 1) == 0) {
              iVar8 = piVar15[(long)(int)uVar4 + -1];
            }
            else if ((int)uVar4 < 1) {
              iVar8 = 0;
            }
            else {
              uVar13 = 0;
              iVar8 = 0;
              do {
                iVar8 = iVar8 + piVar15[uVar13];
                uVar13 = uVar13 + 1;
              } while (uVar4 != uVar13);
            }
            pvVar23 = (void *)((long)pvVar23 + (long)(int)cVar1 * (long)iVar8);
            lVar25 = (long)iVar8;
            if (uVar22 != (uVar11 & 0xffffffff)) {
              lVar25 = 0;
            }
            lVar20 = lVar20 + lVar25;
          }
          else if (0 < (int)uVar4) {
            lVar25 = (long)peVar5[uVar13].user_bytes_per_element;
            pfVar26 = (float *)(peVar5[uVar13].field_12.decode_to_ptr + lVar20 * lVar25);
            uVar14 = 0;
            iVar8 = 0;
            do {
              iVar24 = iVar8;
              iVar9 = piVar15[uVar14];
              if ((decode->decode_flags & 1) != 0) {
                iVar24 = 0;
                iVar9 = iVar8;
              }
              iVar8 = iVar9;
              iVar24 = piVar15[uVar14] - iVar24;
              uVar2 = peVar5[uVar13].data_type;
              if (uVar2 == 0) {
                uVar2 = peVar5[uVar13].user_data_type;
                if (uVar2 == 2) {
                  if (0 < iVar24) {
                    lVar12 = 0;
                    do {
                      *pfVar26 = (float)*(uint *)((long)pvVar23 + lVar12 * 4);
                      pfVar26 = (float *)((long)pfVar26 + lVar25);
                      lVar12 = lVar12 + 1;
                    } while (iVar24 != (int)lVar12);
                  }
                }
                else if (uVar2 == 1) {
                  if (0 < iVar24) {
                    lVar12 = 0;
                    do {
                      uVar21 = *(uint *)((long)pvVar23 + lVar12 * 4);
                      uVar16 = 0x7c00;
                      if (uVar21 < 0xffe1) {
                        fVar18 = (float)(int)uVar21;
                        if ((uint)fVar18 < 0x38800000) {
                          if ((uint)fVar18 < 0x33000001) {
                            uVar16 = 0;
                          }
                          else {
                            uVar21 = (uint)fVar18 & 0x7fffff | 0x800000;
                            cVar7 = (char)((uint)fVar18 >> 0x17);
                            uVar16 = (ushort)(uVar21 >> (0x7eU - cVar7 & 0x1f));
                            if (0x80000000 < uVar21 << (cVar7 + 0xa2U & 0x1f)) {
                              uVar16 = uVar16 + 1;
                            }
                          }
                        }
                        else if ((uint)fVar18 < 0x7f800000) {
                          if ((uint)fVar18 < 0x477ff000) {
                            uVar16 = (ushort)((int)fVar18 + 0x8000fff +
                                              (uint)(((uint)fVar18 >> 0xd & 1) != 0) >> 0xd);
                          }
                        }
                        else if (fVar18 != INFINITY) {
                          uVar21 = (uint)fVar18 >> 0xd & 0x3ff;
                          uVar16 = (ushort)(uVar21 == 0) | (ushort)uVar21 | 0x7c00;
                        }
                      }
                      *(ushort *)pfVar26 = uVar16;
                      pfVar26 = (float *)((long)pfVar26 + lVar25);
                      lVar12 = lVar12 + 1;
                    } while (iVar24 != (int)lVar12);
                  }
                }
                else {
                  if (uVar2 != 0) {
                    return 3;
                  }
                  if (0 < iVar24) {
                    lVar12 = 0;
                    do {
                      *pfVar26 = *(float *)((long)pvVar23 + lVar12 * 4);
                      pfVar26 = (float *)((long)pfVar26 + lVar25);
                      lVar12 = lVar12 + 1;
                    } while (iVar24 != (int)lVar12);
                  }
                }
              }
              else if (uVar2 == 2) {
                uVar2 = peVar5[uVar13].user_data_type;
                if (uVar2 == 2) {
                  if (0 < iVar24) {
                    lVar12 = 0;
                    do {
                      *pfVar26 = *(float *)((long)pvVar23 + lVar12 * 4);
                      pfVar26 = (float *)((long)pfVar26 + lVar25);
                      lVar12 = lVar12 + 1;
                    } while (iVar24 != (int)lVar12);
                  }
                }
                else if (uVar2 == 1) {
                  if (0 < iVar24) {
                    lVar12 = 0;
                    do {
                      uVar21 = *(uint *)((long)pvVar23 + lVar12 * 4);
                      uVar17 = uVar21 & 0x7fffffff;
                      uVar16 = (ushort)(uVar21 >> 0x10) & 0x8000;
                      if (uVar17 < 0x38800000) {
                        if ((0x33000000 < uVar17) &&
                           (uVar21 = uVar21 & 0x7fffff | 0x800000, cVar7 = (char)(uVar17 >> 0x17),
                           uVar16 = uVar16 | (ushort)(uVar21 >> (0x7eU - cVar7 & 0x1f)),
                           0x80000000 < uVar21 << (cVar7 + 0xa2U & 0x1f))) {
                          uVar16 = uVar16 + 1;
                        }
                      }
                      else if (uVar17 < 0x7f800000) {
                        if (uVar17 < 0x477ff000) {
                          uVar16 = (ushort)(uVar17 + 0x8000fff + (uint)((uVar17 >> 0xd & 1) != 0) >>
                                           0xd) | uVar16;
                        }
                        else {
                          uVar16 = uVar16 | 0x7c00;
                        }
                      }
                      else {
                        uVar16 = uVar16 | 0x7c00;
                        if (uVar17 != 0x7f800000) {
                          uVar21 = uVar17 >> 0xd & 0x3ff;
                          uVar16 = uVar16 | (ushort)uVar21 | (ushort)(uVar21 == 0);
                        }
                      }
                      *(ushort *)pfVar26 = uVar16;
                      pfVar26 = (float *)((long)pfVar26 + lVar25);
                      lVar12 = lVar12 + 1;
                    } while (iVar24 != (int)lVar12);
                  }
                }
                else {
                  if (uVar2 != 0) {
                    return 3;
                  }
                  if (0 < iVar24) {
                    lVar12 = 0;
                    do {
                      fVar18 = *(float *)((long)pvVar23 + lVar12 * 4);
                      fVar19 = 0.0;
                      if (0.0 <= fVar18) {
                        fVar19 = (float)(long)fVar18;
                        if (ABS(fVar18) == INFINITY) {
                          fVar19 = -NAN;
                        }
                        if (4.2949673e+09 < fVar18) {
                          fVar19 = -NAN;
                        }
                      }
                      *pfVar26 = fVar19;
                      pfVar26 = (float *)((long)pfVar26 + lVar25);
                      lVar12 = lVar12 + 1;
                    } while (iVar24 != (int)lVar12);
                  }
                }
              }
              else {
                if (uVar2 != 1) {
                  return 3;
                }
                uVar2 = peVar5[uVar13].user_data_type;
                if (uVar2 == 2) {
                  if (0 < iVar24) {
                    lVar12 = 0;
                    do {
                      uVar17 = (uint)*(short *)((long)pvVar23 + lVar12 * 2);
                      uVar21 = (uVar17 & 0x7fff) << 0xd;
                      fVar18 = (float)(uVar17 & 0x80000000);
                      if (uVar21 < 0x800000) {
                        if ((uVar17 & 0x7fff) != 0) {
                          uVar6 = 0x1f;
                          if ((uVar17 & 0x7fff) != 0) {
                            for (; uVar21 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                            }
                          }
                          iVar9 = (uVar6 ^ 0x1f) - 8;
                          fVar18 = (float)(((uint)fVar18 | uVar21 << ((byte)iVar9 & 0x1f) |
                                           0x38800000) + iVar9 * -0x800000);
                        }
                      }
                      else if (uVar21 < 0xf800000) {
                        fVar18 = (float)(((uint)fVar18 | uVar21) + 0x38000000);
                      }
                      else {
                        fVar18 = (float)((uint)fVar18 | uVar21 | 0x7f800000);
                      }
                      *pfVar26 = fVar18;
                      pfVar26 = (float *)((long)pfVar26 + lVar25);
                      lVar12 = lVar12 + 1;
                    } while (iVar24 != (int)lVar12);
                  }
                }
                else if (uVar2 == 1) {
                  if (0 < iVar24) {
                    lVar12 = 0;
                    do {
                      *(ushort *)pfVar26 = *(ushort *)((long)pvVar23 + lVar12 * 2);
                      pfVar26 = (float *)((long)pfVar26 + lVar25);
                      lVar12 = lVar12 + 1;
                    } while (iVar24 != (int)lVar12);
                  }
                }
                else {
                  if (uVar2 != 0) {
                    return 3;
                  }
                  if (0 < iVar24) {
                    lVar12 = 0;
                    do {
                      uVar16 = *(ushort *)((long)pvVar23 + lVar12 * 2);
                      uVar21 = (uint)uVar16;
                      if ((short)uVar16 < 0) {
                        fVar18 = 0.0;
                      }
                      else if ((~uVar21 & 0x7c00) == 0) {
                        fVar18 = (float)-(uint)((uVar16 & 0x3ff) == 0);
                      }
                      else {
                        uVar17 = uVar21 * 0x2000;
                        if (uVar21 < 0x400) {
                          if (uVar16 == 0) {
                            fVar18 = 0.0;
                          }
                          else {
                            uVar6 = 0x1f;
                            if (uVar21 != 0) {
                              for (; uVar17 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                              }
                            }
                            iVar9 = (uVar6 ^ 0x1f) - 8;
                            fVar18 = (float)((uVar17 << ((byte)iVar9 & 0x1f) | 0x38800000) +
                                            iVar9 * -0x800000);
                          }
                        }
                        else if (uVar21 < 0x7c00) {
                          fVar18 = (float)(uVar17 + 0x38000000);
                        }
                        else {
                          fVar18 = (float)(uVar17 | 0x7f800000);
                        }
                        fVar18 = (float)(long)fVar18;
                      }
                      *pfVar26 = fVar18;
                      pfVar26 = (float *)((long)pfVar26 + lVar25);
                      lVar12 = lVar12 + 1;
                    } while (iVar24 != (int)lVar12);
                  }
                }
              }
              pvVar23 = (void *)((long)pvVar23 + (long)(iVar24 * cVar1));
              lVar12 = (long)iVar24;
              if (uVar22 != (uVar11 & 0xffffffff)) {
                lVar12 = 0;
              }
              lVar20 = lVar20 + lVar12;
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar4);
            uVar16 = decode->channel_count;
          }
          uVar11 = (ulong)(short)uVar16;
          uVar13 = uVar22;
        } while ((long)uVar22 < (long)uVar11);
      }
      piVar15 = piVar15 + (int)uVar4;
      iVar10 = iVar10 + 1;
    } while (iVar10 != iVar3);
  }
  return 0;
}

Assistant:

static exr_result_t
generic_unpack_deep (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer  = (const uint8_t*) decode->unpacked_buffer;
    const int32_t* sampbuffer = decode->sample_count_table;
    uint8_t*       cdata;
    int            w, h, bpc, ubpc;
    size_t         totsamps = 0;

    w = decode->chunk.width;
    h = decode->chunk.height;

    for (int y = 0; y < h; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc      = (decode->channels + c);
            int32_t                    prevsamps = 0;

            int incr_tot = ((c + 1) == decode->channel_count);

            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_bytes_per_element;
            cdata = decc->decode_to_ptr;

            if (!cdata)
            {
                prevsamps = 0;
                if ((decode->decode_flags &
                     EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    for (int x = 0; x < w; ++x)
                        prevsamps += sampbuffer[x];
                }
                else
                    prevsamps = sampbuffer[w - 1];
                srcbuffer += ((size_t) bpc) * ((size_t) prevsamps);

                if (incr_tot) totsamps += (size_t) prevsamps;

                continue;
            }
            cdata += totsamps * ((size_t) ubpc);

            for (int x = 0; x < w; ++x)
            {
                int32_t samps = sampbuffer[x];
                if (0 == (decode->decode_flags &
                          EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    int32_t tmp = samps - prevsamps;
                    prevsamps   = samps;
                    samps       = tmp;
                }

                UNPACK_SAMPLES (samps)

                srcbuffer += bpc * samps;
                if (incr_tot) totsamps += (size_t) samps;
            }
        }
        sampbuffer += w;
    }

    return EXR_ERR_SUCCESS;
}